

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_avx2_256_8.c
# Opt level: O2

parasail_result_t *
parasail_nw_diag_avx2_256_8
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  undefined8 uVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  uint uVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  parasail_result_t *ppVar11;
  int8_t *ptr;
  int8_t *ptr_00;
  int8_t *ptr_01;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  char *pcVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  char cVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  char *__format;
  uint uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 uVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar62 [64];
  uint local_2b0;
  uint local_2a8;
  uint local_2a0;
  int8_t *local_290;
  uint local_288;
  uint local_280;
  uint local_278;
  undefined1 local_1a8 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 auVar49 [32];
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar15 = "_s2";
  }
  else {
    uVar14 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar15 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar15 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar15 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar15 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        _s1Len = matrix->length;
LAB_007145c1:
        auVar32._4_4_ = gap;
        auVar32._0_4_ = gap;
        auVar32._8_4_ = gap;
        auVar32._12_4_ = gap;
        auVar53._16_4_ = gap;
        auVar53._0_16_ = auVar32;
        auVar53._20_4_ = gap;
        auVar53._24_4_ = gap;
        auVar53._28_4_ = gap;
        auVar31 = vpinsrd_avx(auVar32,gap,1);
        auVar31 = vpinsrd_avx(auVar31,gap,2);
        auVar31 = vpinsrd_avx(auVar31,open,3);
        auVar33._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar32;
        auVar33._16_16_ = ZEXT116(0) * auVar53._16_16_ + ZEXT116(1) * auVar31;
        auVar33 = vpmulld_avx2(auVar33,_DAT_008a5d00);
        uVar16 = auVar33._28_4_;
        uVar22 = (uint)(byte)-(char)matrix->min;
        if ((int)uVar16 < matrix->min) {
          uVar22 = open;
        }
        cVar7 = '~' - (char)matrix->max;
        auVar62 = ZEXT1664(in_ZMM14._0_16_);
        ppVar11 = parasail_result_new();
        if (ppVar11 != (parasail_result_t *)0x0) {
          ppVar11->flag = ppVar11->flag | 0x20101001;
          uVar18 = (ulong)(s2Len + 0x3e);
          ptr = parasail_memalign_int8_t(0x20,uVar18);
          ptr_00 = parasail_memalign_int8_t(0x20,uVar18);
          ptr_01 = parasail_memalign_int8_t(0x20,uVar18);
          if (ptr_01 != (int8_t *)0x0 && (ptr_00 != (int8_t *)0x0 && ptr != (int8_t *)0x0)) {
            lVar12 = (long)_s1Len;
            if (matrix->type == 0) {
              local_290 = parasail_memalign_int8_t(0x20,(long)(int)(_s1Len + 0x1f));
              if (local_290 == (int8_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              for (uVar18 = 0; lVar19 = lVar12, (uint)(~(_s1Len >> 0x1f) & _s1Len) != uVar18;
                  uVar18 = uVar18 + 1) {
                local_290[uVar18] = (int8_t)matrix->mapper[(byte)_s1[uVar18]];
              }
              for (; lVar19 < (int)(_s1Len + 0x1f); lVar19 = lVar19 + 1) {
                local_290[lVar19] = '\0';
              }
            }
            else {
              local_290 = (int8_t *)0x0;
            }
            auVar48._4_4_ = open;
            auVar48._0_4_ = open;
            auVar48._8_4_ = open;
            auVar48._12_4_ = open;
            auVar49._16_4_ = open;
            auVar49._0_16_ = auVar48;
            auVar49._20_4_ = open;
            auVar49._24_4_ = open;
            auVar49._28_4_ = open;
            auVar31 = vpinsrd_avx(auVar48,open,1);
            auVar31 = vpinsrd_avx(auVar31,open,2);
            auVar47 = vpinsrd_avx(auVar31,gap << 4,3);
            auVar31 = vpmulld_avx(auVar32,_DAT_008a1c10);
            auVar31 = vpsubd_avx(auVar31,auVar48);
            auVar31 = vpshufb_avx(auVar31,_DAT_008a3d30);
            auVar31 = vpinsrb_avx(auVar31,gap * 0xf5 - open,4);
            auVar31 = vpinsrb_avx(auVar31,gap * 0xf6 - open,5);
            auVar31 = vpinsrb_avx(auVar31,gap * 0xf7 - open,6);
            auVar31 = vpinsrb_avx(auVar31,uVar16 + gap * -8,7);
            auVar31 = vpinsrb_avx(auVar31,gap * 0xf9 - open,8);
            auVar31 = vpinsrb_avx(auVar31,gap * 0xfa - open,9);
            auVar31 = vpinsrb_avx(auVar31,gap * 0xfb - open,10);
            auVar31 = vpinsrb_avx(auVar31,uVar16 + gap * -4,0xb);
            auVar32 = vpinsrd_avx(ZEXT416((uint)_s1Len),s2Len,1);
            auVar3 = vpinsrb_avx(auVar31,gap * 0xfd - open,0xc);
            uVar8 = s2Len + 0x1f;
            auVar4 = vpmulld_avx2(auVar53,_DAT_008a5d20);
            auVar31 = vpcmpeqd_avx(auVar31,auVar31);
            auVar32 = vpaddd_avx(auVar32,auVar31);
            cVar20 = (char)uVar22 + -0x7f;
            auVar44[0] = (char)gap;
            auVar44[1] = auVar44[0];
            auVar44[2] = auVar44[0];
            auVar44[3] = auVar44[0];
            auVar44[4] = auVar44[0];
            auVar44[5] = auVar44[0];
            auVar44[6] = auVar44[0];
            auVar44[7] = auVar44[0];
            auVar44[8] = auVar44[0];
            auVar44[9] = auVar44[0];
            auVar44[10] = auVar44[0];
            auVar44[0xb] = auVar44[0];
            auVar44[0xc] = auVar44[0];
            auVar44[0xd] = auVar44[0];
            auVar44[0xe] = auVar44[0];
            auVar44[0xf] = auVar44[0];
            auVar44[0x10] = auVar44[0];
            auVar44[0x11] = auVar44[0];
            auVar44[0x12] = auVar44[0];
            auVar44[0x13] = auVar44[0];
            auVar44[0x14] = auVar44[0];
            auVar44[0x15] = auVar44[0];
            auVar44[0x16] = auVar44[0];
            auVar44[0x17] = auVar44[0];
            auVar44[0x18] = auVar44[0];
            auVar44[0x19] = auVar44[0];
            auVar44[0x1a] = auVar44[0];
            auVar44[0x1b] = auVar44[0];
            auVar44[0x1c] = auVar44[0];
            auVar44[0x1d] = auVar44[0];
            auVar44[0x1e] = auVar44[0];
            auVar44[0x1f] = auVar44[0];
            auVar50[8] = 0xe0;
            auVar50._0_8_ = 0xe0e0e0e0e0e0e0e0;
            auVar50[9] = 0xe0;
            auVar50[10] = 0xe0;
            auVar50[0xb] = 0xe0;
            auVar50[0xc] = 0xe0;
            auVar50[0xd] = 0xe0;
            auVar50[0xe] = 0xe0;
            auVar50[0xf] = 0xe0;
            auVar50[0x10] = 0xe0;
            auVar50[0x11] = 0xe0;
            auVar50[0x12] = 0xe0;
            auVar50[0x13] = 0xe0;
            auVar50[0x14] = 0xe0;
            auVar50[0x15] = 0xe0;
            auVar50[0x16] = 0xe0;
            auVar50[0x17] = 0xe0;
            auVar50[0x18] = 0xe0;
            auVar50[0x19] = 0xe0;
            auVar50[0x1a] = 0xe0;
            auVar50[0x1b] = 0xe0;
            auVar50[0x1c] = 0xe0;
            auVar50[0x1d] = 0xe0;
            auVar50[0x1e] = 0xe0;
            auVar50[0x1f] = 0xe0;
            auVar53 = vpsllw_avx2(auVar44,5);
            auVar50 = vpand_avx2(auVar53,auVar50);
            auVar41[0] = (undefined1)_s1Len;
            auVar41[1] = auVar41[0];
            auVar41[2] = auVar41[0];
            auVar41[3] = auVar41[0];
            auVar41[4] = auVar41[0];
            auVar41[5] = auVar41[0];
            auVar41[6] = auVar41[0];
            auVar41[7] = auVar41[0];
            auVar41[8] = auVar41[0];
            auVar41[9] = auVar41[0];
            auVar41[10] = auVar41[0];
            auVar41[0xb] = auVar41[0];
            auVar41[0xc] = auVar41[0];
            auVar41[0xd] = auVar41[0];
            auVar41[0xe] = auVar41[0];
            auVar41[0xf] = auVar41[0];
            auVar41[0x10] = auVar41[0];
            auVar41[0x11] = auVar41[0];
            auVar41[0x12] = auVar41[0];
            auVar41[0x13] = auVar41[0];
            auVar41[0x14] = auVar41[0];
            auVar41[0x15] = auVar41[0];
            auVar41[0x16] = auVar41[0];
            auVar41[0x17] = auVar41[0];
            auVar41[0x18] = auVar41[0];
            auVar41[0x19] = auVar41[0];
            auVar41[0x1a] = auVar41[0];
            auVar41[0x1b] = auVar41[0];
            auVar41[0x1c] = auVar41[0];
            auVar41[0x1d] = auVar41[0];
            auVar41[0x1e] = auVar41[0];
            auVar41[0x1f] = auVar41[0];
            auVar53 = vpcmpeqd_avx2(auVar50,auVar50);
            auVar41 = vpaddsb_avx2(auVar41,auVar53);
            auVar42[0] = (undefined1)s2Len;
            auVar42[1] = auVar42[0];
            auVar42[2] = auVar42[0];
            auVar42[3] = auVar42[0];
            auVar42[4] = auVar42[0];
            auVar42[5] = auVar42[0];
            auVar42[6] = auVar42[0];
            auVar42[7] = auVar42[0];
            auVar42[8] = auVar42[0];
            auVar42[9] = auVar42[0];
            auVar42[10] = auVar42[0];
            auVar42[0xb] = auVar42[0];
            auVar42[0xc] = auVar42[0];
            auVar42[0xd] = auVar42[0];
            auVar42[0xe] = auVar42[0];
            auVar42[0xf] = auVar42[0];
            auVar42[0x10] = auVar42[0];
            auVar42[0x11] = auVar42[0];
            auVar42[0x12] = auVar42[0];
            auVar42[0x13] = auVar42[0];
            auVar42[0x14] = auVar42[0];
            auVar42[0x15] = auVar42[0];
            auVar42[0x16] = auVar42[0];
            auVar42[0x17] = auVar42[0];
            auVar42[0x18] = auVar42[0];
            auVar42[0x19] = auVar42[0];
            auVar42[0x1a] = auVar42[0];
            auVar42[0x1b] = auVar42[0];
            auVar42[0x1c] = auVar42[0];
            auVar42[0x1d] = auVar42[0];
            auVar42[0x1e] = auVar42[0];
            auVar42[0x1f] = auVar42[0];
            auVar42 = vpaddsb_avx2(auVar42,auVar53);
            auVar43[1] = cVar20;
            auVar43[0] = cVar20;
            auVar43[2] = cVar20;
            auVar43[3] = cVar20;
            auVar43[4] = cVar20;
            auVar43[5] = cVar20;
            auVar43[6] = cVar20;
            auVar43[7] = cVar20;
            auVar43[8] = cVar20;
            auVar43[9] = cVar20;
            auVar43[10] = cVar20;
            auVar43[0xb] = cVar20;
            auVar43[0xc] = cVar20;
            auVar43[0xd] = cVar20;
            auVar43[0xe] = cVar20;
            auVar43[0xf] = cVar20;
            auVar43[0x10] = cVar20;
            auVar43[0x11] = cVar20;
            auVar43[0x12] = cVar20;
            auVar43[0x13] = cVar20;
            auVar43[0x14] = cVar20;
            auVar43[0x15] = cVar20;
            auVar43[0x16] = cVar20;
            auVar43[0x17] = cVar20;
            auVar43[0x18] = cVar20;
            auVar43[0x19] = cVar20;
            auVar43[0x1a] = cVar20;
            auVar43[0x1b] = cVar20;
            auVar43[0x1c] = cVar20;
            auVar43[0x1d] = cVar20;
            auVar43[0x1e] = cVar20;
            auVar43[0x1f] = cVar20;
            uVar45 = (undefined1)open;
            auVar54[1] = uVar45;
            auVar54[0] = uVar45;
            auVar54[2] = uVar45;
            auVar54[3] = uVar45;
            auVar54[4] = uVar45;
            auVar54[5] = uVar45;
            auVar54[6] = uVar45;
            auVar54[7] = uVar45;
            auVar54[8] = uVar45;
            auVar54[9] = uVar45;
            auVar54[10] = uVar45;
            auVar54[0xb] = uVar45;
            auVar54[0xc] = uVar45;
            auVar54[0xd] = uVar45;
            auVar54[0xe] = uVar45;
            auVar54[0xf] = uVar45;
            auVar54[0x10] = uVar45;
            auVar54[0x11] = uVar45;
            auVar54[0x12] = uVar45;
            auVar54[0x13] = uVar45;
            auVar54[0x14] = uVar45;
            auVar54[0x15] = uVar45;
            auVar54[0x16] = uVar45;
            auVar54[0x17] = uVar45;
            auVar54[0x18] = uVar45;
            auVar54[0x19] = uVar45;
            auVar54[0x1a] = uVar45;
            auVar54[0x1b] = uVar45;
            auVar54[0x1c] = uVar45;
            auVar54[0x1d] = uVar45;
            auVar54[0x1e] = uVar45;
            auVar54[0x1f] = uVar45;
            auVar3 = vpinsrb_avx(auVar3,uVar16 + gap * -2,0xd);
            auVar46._0_16_ = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar48;
            auVar46._16_16_ = ZEXT116(0) * auVar49._16_16_ + ZEXT116(1) * auVar47;
            auVar53 = vpsubd_avx2(auVar33,auVar46);
            auVar4 = vpsubd_avx2(auVar4,auVar49);
            auVar55._8_4_ = 0xff;
            auVar55._0_8_ = 0xff000000ff;
            auVar55._12_4_ = 0xff;
            auVar55._16_4_ = 0xff;
            auVar55._20_4_ = 0xff;
            auVar55._24_4_ = 0xff;
            auVar55._28_4_ = 0xff;
            auVar53 = vpand_avx2(auVar55,auVar53);
            auVar4 = vpand_avx2(auVar55,auVar4);
            auVar53 = vpackusdw_avx2(auVar4,auVar53);
            auVar31 = vpackuswb_avx(auVar53._0_16_,auVar53._16_16_);
            auVar3 = vpinsrb_avx(auVar3,uVar16 - gap,0xe);
            auVar3 = vpinsrb_avx(auVar3,uVar16,0xf);
            auVar31 = vpshufd_avx(auVar31,0xd8);
            local_1a8._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar31;
            local_1a8._16_16_ = ZEXT116(1) * auVar3;
            for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
              ptr[uVar18 + 0x1f] = (int8_t)matrix->mapper[(byte)_s2[uVar18]];
            }
            for (lVar19 = 0; uVar18 = uVar14, lVar19 != 0x1f; lVar19 = lVar19 + 1) {
              ptr[lVar19] = '\0';
            }
            for (; (int)uVar18 < (int)uVar8; uVar18 = uVar18 + 1) {
              ptr[uVar18 + 0x1f] = '\0';
            }
            uVar22 = uVar16;
            for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
              ptr_00[uVar18 + 0x1f] = (char)uVar22;
              ptr_01[uVar18 + 0x1f] = cVar20;
              uVar22 = (uint)(byte)((char)uVar22 - auVar44[0]);
            }
            for (lVar19 = 0; lVar19 != 0x1f; lVar19 = lVar19 + 1) {
              ptr_00[lVar19] = cVar20;
              ptr_01[lVar19] = cVar20;
            }
            for (; (int)uVar14 < (int)uVar8; uVar14 = uVar14 + 1) {
              ptr_00[uVar14 + 0x1f] = cVar20;
              ptr_01[uVar14 + 0x1f] = cVar20;
            }
            ptr_00[0x1e] = '\0';
            auVar53 = vpalignr_avx2(ZEXT1632(auVar43._16_16_),auVar43,1);
            uVar22 = auVar32._0_4_;
            auVar31._4_4_ = _s1Len;
            auVar31._0_4_ = _s1Len;
            auVar31._8_4_ = _s1Len;
            auVar31._12_4_ = _s1Len;
            auVar4 = vpmovsxdq_avx2(auVar31);
            local_178._8_8_ = 0x1011121314151617;
            local_178._0_8_ = 0x18191a1b1c1d1e1f;
            local_178._16_8_ = 0x8090a0b0c0d0e0f;
            local_178._24_8_ = 0x1020304050607;
            uVar14 = 0;
            auVar57 = ZEXT3264(auVar43);
            auVar58 = ZEXT3264(CONCAT131(cVar7,CONCAT130(cVar7,CONCAT129(cVar7,CONCAT128(cVar7,
                                                  CONCAT127(cVar7,CONCAT126(cVar7,CONCAT125(cVar7,
                                                  CONCAT124(cVar7,CONCAT123(cVar7,CONCAT122(cVar7,
                                                  CONCAT121(cVar7,CONCAT120(cVar7,CONCAT119(cVar7,
                                                  CONCAT118(cVar7,CONCAT117(cVar7,CONCAT116(cVar7,
                                                  CONCAT115(cVar7,CONCAT114(cVar7,CONCAT113(cVar7,
                                                  CONCAT112(cVar7,CONCAT111(cVar7,CONCAT110(cVar7,
                                                  CONCAT19(cVar7,CONCAT18(cVar7,CONCAT17(cVar7,
                                                  CONCAT16(cVar7,CONCAT15(cVar7,CONCAT14(cVar7,
                                                  CONCAT13(cVar7,CONCAT12(cVar7,CONCAT11(cVar7,cVar7
                                                                                        ))))))))))))
                                                  ))))))))))))))))))));
            local_158 = auVar43;
            while (auVar46 = auVar62._32_32_, (long)uVar14 < lVar12) {
              uVar6 = (uint)uVar14;
              if (matrix->type == 0) {
                auVar3._8_8_ = 0;
                auVar3._0_8_ = *(ulong *)(local_290 + uVar14 + 9);
                auVar49 = vpmovsxbd_avx2(auVar3);
                auVar47._8_8_ = 0;
                auVar47._0_8_ = *(ulong *)(local_290 + uVar14 + 1);
                auVar55 = vpmovsxbd_avx2(auVar47);
                uVar27 = (uint)local_290[uVar14 + 0x11];
                local_278 = (uint)local_290[uVar14 + 0x12];
                uVar29 = (uint)local_290[uVar14 + 0x13];
                local_280 = (uint)local_290[uVar14 + 0x14];
                uVar28 = (uint)local_290[uVar14 + 0x15];
                uVar24 = (uint)local_290[uVar14 + 0x16];
                uVar9 = (uint)local_290[uVar14 + 0x17];
                local_2a0 = (uint)local_290[uVar14 + 0x18];
                uVar13 = (uint)local_290[uVar14 + 0x19];
                uVar21 = (uint)local_290[uVar14 + 0x1a];
                uVar17 = (uint)local_290[uVar14 + 0x1b];
                local_288 = (uint)local_290[uVar14 + 0x1c];
                uVar23 = (uint)local_290[uVar14 + 0x1d];
                local_2a8 = (uint)local_290[uVar14 + 0x1e];
                uVar26 = (int)local_290[uVar14];
                local_2b0 = (int)local_290[uVar14 + 0x1f];
              }
              else {
                auVar34._8_8_ = uVar14;
                auVar34._0_8_ = uVar14;
                auVar34._16_8_ = uVar14;
                auVar34._24_8_ = uVar14;
                auVar5 = vpor_avx2(auVar34,_DAT_008a5d40);
                auVar39 = vpor_avx2(auVar34,_DAT_008a5d60);
                auVar36 = vpor_avx2(auVar34,_DAT_008a5be0);
                auVar34 = vpor_avx2(auVar34,_DAT_008a5c00);
                auVar46 = vpcmpgtq_avx2(auVar4,auVar34);
                auVar49 = vpcmpgtq_avx2(auVar4,auVar36);
                auVar46 = vpackssdw_avx2(auVar49,auVar46);
                auVar37 = vpermq_avx2(auVar46,0xd8);
                auVar49 = vpcmpgtq_avx2(auVar4,auVar39);
                auVar55 = vpcmpgtq_avx2(auVar4,auVar5);
                auVar46 = (undefined1  [32])0x0;
                auVar49 = vpackssdw_avx2(auVar55,auVar49);
                auVar40 = vpermq_avx2(auVar49,0xd8);
                auVar49 = vpmovsxbd_avx2(ZEXT816(0x706060406040200));
                auVar55 = vpermd_avx2(auVar49,auVar36);
                auVar36 = vpermd_avx2(auVar49,auVar34);
                auVar35._0_16_ = ZEXT116(0) * auVar36._0_16_ + ZEXT116(1) * auVar55._0_16_;
                auVar35._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar36._0_16_;
                auVar55 = vpermd_avx2(auVar49,auVar5);
                auVar49 = vpermd_avx2(auVar49,auVar39);
                auVar39._0_16_ = ZEXT116(0) * auVar49._0_16_ + ZEXT116(1) * auVar55._0_16_;
                auVar39._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar49._0_16_;
                auVar5._4_4_ = uVar22;
                auVar5._0_4_ = uVar22;
                auVar5._8_4_ = uVar22;
                auVar5._12_4_ = uVar22;
                auVar5._16_4_ = uVar22;
                auVar5._20_4_ = uVar22;
                auVar5._24_4_ = uVar22;
                auVar5._28_4_ = uVar22;
                auVar49 = vblendvps_avx(auVar5,auVar39,auVar40);
                auVar55 = vblendvps_avx(auVar5,auVar35,auVar37);
                uVar27 = uVar6 | 0x11;
                if (lVar12 <= (long)(uVar14 | 0x11)) {
                  uVar27 = uVar22;
                }
                local_278 = uVar6 | 0x12;
                if (lVar12 <= (long)(uVar14 | 0x12)) {
                  local_278 = uVar22;
                }
                uVar29 = uVar6 | 0x13;
                if (lVar12 <= (long)(uVar14 | 0x13)) {
                  uVar29 = uVar22;
                }
                local_280 = uVar6 | 0x14;
                if (lVar12 <= (long)(uVar14 | 0x14)) {
                  local_280 = uVar22;
                }
                uVar28 = uVar6 | 0x15;
                if (lVar12 <= (long)(uVar14 | 0x15)) {
                  uVar28 = uVar22;
                }
                uVar24 = uVar6 | 0x16;
                if (lVar12 <= (long)(uVar14 | 0x16)) {
                  uVar24 = uVar22;
                }
                uVar9 = uVar6 | 0x17;
                if (lVar12 <= (long)(uVar14 | 0x17)) {
                  uVar9 = uVar22;
                }
                local_2a0 = uVar6 | 0x18;
                if (lVar12 <= (long)(uVar14 | 0x18)) {
                  local_2a0 = uVar22;
                }
                uVar13 = uVar6 | 0x19;
                if (lVar12 <= (long)(uVar14 | 0x19)) {
                  uVar13 = uVar22;
                }
                uVar21 = uVar6 | 0x1a;
                if (lVar12 <= (long)(uVar14 | 0x1a)) {
                  uVar21 = uVar22;
                }
                uVar17 = uVar6 | 0x1b;
                if (lVar12 <= (long)(uVar14 | 0x1b)) {
                  uVar17 = uVar22;
                }
                local_288 = uVar6 | 0x1c;
                if (lVar12 <= (long)(uVar14 | 0x1c)) {
                  local_288 = uVar22;
                }
                uVar23 = uVar6 | 0x1d;
                if (lVar12 <= (long)(uVar14 | 0x1d)) {
                  uVar23 = uVar22;
                }
                local_2a8 = uVar6 | 0x1e;
                if (lVar12 <= (long)(uVar14 | 0x1e)) {
                  local_2a8 = uVar22;
                }
                uVar26 = uVar6;
                local_2b0 = uVar6 | 0x1f;
                if (lVar12 <= (long)(uVar14 | 0x1f)) {
                  local_2b0 = uVar22;
                }
              }
              iVar10 = matrix->size;
              iVar25 = vextractps_avx(auVar49._16_16_,3);
              piVar2 = matrix->matrix;
              auVar36._16_16_ = _DAT_008a5db0;
              auVar36._0_16_ = _DAT_008a5db0;
              auVar5 = vpermps_avx2(auVar36,auVar55);
              auVar59._16_16_ = _DAT_008a5dc0;
              auVar59._0_16_ = _DAT_008a5dc0;
              auVar39 = vpermps_avx2(auVar59,auVar49);
              auVar5 = vblendps_avx(auVar5,auVar39,0xe0);
              auVar49 = vshufps_avx(auVar49,auVar55,0x22);
              auVar55 = vpermpd_avx2(auVar49,0x72);
              auVar49 = vblendps_avx(auVar5,ZEXT432(uVar26),1);
              auVar40._4_4_ = iVar10;
              auVar40._0_4_ = iVar10;
              auVar40._8_4_ = iVar10;
              auVar40._12_4_ = iVar10;
              auVar40._16_4_ = iVar10;
              auVar40._20_4_ = iVar10;
              auVar40._24_4_ = iVar10;
              auVar40._28_4_ = iVar10;
              auVar39 = vpmulld_avx2(auVar49,auVar40);
              auVar36 = vpmulld_avx2(auVar55,auVar40);
              auVar47 = auVar53._16_16_;
              auVar31 = vpinsrb_avx(auVar47,uVar16 - uVar6 * gap,0xf);
              uVar14 = uVar14 + 0x20;
              auVar3 = vpinsrb_avx(auVar47,(uint)(byte)ptr_00[0x1e],0xf);
              ptr_00[0x1e] = auVar33[0x1c] - (char)uVar14 * auVar44[0];
              auVar37._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar53._0_16_;
              auVar37._16_16_ = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar3;
              auVar62._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar53._0_16_;
              auVar62._16_16_ = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar31;
              auVar62._32_32_ = auVar46;
              auVar5 = vpcmpeqb_avx2(local_178,auVar41);
              auVar55 = auVar43;
              auVar46 = _DAT_008a5d80;
              auVar49 = auVar43;
              for (uVar18 = 0; (~((int)uVar8 >> 0x1f) & uVar8) != uVar18; uVar18 = uVar18 + 1) {
                auVar31 = vpinsrb_avx(ZEXT416((uint)piVar2[(long)auVar36._0_4_ +
                                                           (long)ptr[uVar18 + 0x10]]),
                                      (uint)*(byte *)(piVar2 + (long)auVar39._28_4_ +
                                                               (long)ptr[uVar18 + 0x11]),1);
                auVar31 = vpinsrb_avx(auVar31,(uint)*(byte *)(piVar2 + (long)auVar36._4_4_ +
                                                                       (long)ptr[uVar18 + 0x12]),2);
                auVar31 = vpinsrb_avx(auVar31,(uint)*(byte *)(piVar2 + (long)auVar39._24_4_ +
                                                                       (long)ptr[uVar18 + 0x13]),3);
                auVar31 = vpinsrb_avx(auVar31,(uint)*(byte *)(piVar2 + (long)auVar36._8_4_ +
                                                                       (long)ptr[uVar18 + 0x14]),4);
                auVar31 = vpinsrb_avx(auVar31,(uint)*(byte *)(piVar2 + (long)auVar39._20_4_ +
                                                                       (long)ptr[uVar18 + 0x15]),5);
                auVar31 = vpinsrb_avx(auVar31,(uint)*(byte *)(piVar2 + (long)auVar36._12_4_ +
                                                                       (long)ptr[uVar18 + 0x16]),6);
                auVar31 = vpinsrb_avx(auVar31,(uint)*(byte *)(piVar2 + (long)auVar39._16_4_ +
                                                                       (long)ptr[uVar18 + 0x17]),7);
                auVar31 = vpinsrb_avx(auVar31,(uint)*(byte *)(piVar2 + (long)auVar36._16_4_ +
                                                                       (long)ptr[uVar18 + 0x18]),8);
                auVar31 = vpinsrb_avx(auVar31,(uint)*(byte *)(piVar2 + (long)auVar39._12_4_ +
                                                                       (long)ptr[uVar18 + 0x19]),9);
                auVar31 = vpinsrb_avx(auVar31,(uint)*(byte *)(piVar2 + (long)auVar36._20_4_ +
                                                                       (long)ptr[uVar18 + 0x1a]),10)
                ;
                auVar31 = vpinsrb_avx(auVar31,(uint)*(byte *)(piVar2 + (long)auVar39._8_4_ +
                                                                       (long)ptr[uVar18 + 0x1b]),0xb
                                     );
                auVar31 = vpinsrb_avx(auVar31,(uint)*(byte *)(piVar2 + (long)auVar36._24_4_ +
                                                                       (long)ptr[uVar18 + 0x1c]),0xc
                                     );
                auVar31 = vpinsrb_avx(auVar31,(uint)*(byte *)(piVar2 + (long)auVar39._4_4_ +
                                                                       (long)ptr[uVar18 + 0x1d]),0xd
                                     );
                auVar31 = vpinsrb_avx(auVar31,(uint)*(byte *)(piVar2 + (long)auVar36._28_4_ +
                                                                       (long)ptr[uVar18 + 0x1e]),0xe
                                     );
                auVar31 = vpinsrb_avx(auVar31,(uint)*(byte *)(piVar2 + (long)auVar39._0_4_ +
                                                                       (long)ptr[uVar18 + 0x1f]),0xf
                                     );
                auVar3 = vpinsrb_avx(ZEXT416((uint)piVar2[(long)(int)(local_2b0 * iVar10) +
                                                          (long)ptr[uVar18]]),
                                     (uint)*(byte *)(piVar2 + (long)(int)(local_2a8 * iVar10) +
                                                              (long)ptr[uVar18 + 1]),1);
                auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar23 * iVar10) +
                                                                     (long)ptr[uVar18 + 2]),2);
                auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(local_288 * iVar10)
                                                                     + (long)ptr[uVar18 + 3]),3);
                auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar17 * iVar10) +
                                                                     (long)ptr[uVar18 + 4]),4);
                auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar21 * iVar10) +
                                                                     (long)ptr[uVar18 + 5]),5);
                auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar13 * iVar10) +
                                                                     (long)ptr[uVar18 + 6]),6);
                auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(local_2a0 * iVar10)
                                                                     + (long)ptr[uVar18 + 7]),7);
                auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar9 * iVar10) +
                                                                     (long)ptr[uVar18 + 8]),8);
                auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar24 * iVar10) +
                                                                     (long)ptr[uVar18 + 9]),9);
                auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar28 * iVar10) +
                                                                     (long)ptr[uVar18 + 10]),10);
                auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(local_280 * iVar10)
                                                                     + (long)ptr[uVar18 + 0xb]),0xb)
                ;
                auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar29 * iVar10) +
                                                                     (long)ptr[uVar18 + 0xc]),0xc);
                auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(local_278 * iVar10)
                                                                     + (long)ptr[uVar18 + 0xd]),0xd)
                ;
                auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(int)(uVar27 * iVar10) +
                                                                     (long)ptr[uVar18 + 0xe]),0xe);
                auVar3 = vpinsrb_avx(auVar3,(uint)*(byte *)(piVar2 + (long)(iVar25 * iVar10) +
                                                                     (long)ptr[uVar18 + 0xf]),0xf);
                auVar60[0] = auVar62[0x10];
                auVar60[1] = auVar60[0];
                auVar60[2] = auVar60[0];
                auVar60[3] = auVar60[0];
                auVar60[4] = auVar60[0];
                auVar60[5] = auVar60[0];
                auVar60[6] = auVar60[0];
                auVar60[7] = auVar60[0];
                auVar60[8] = auVar60[0];
                auVar60[9] = auVar60[0];
                auVar60[10] = auVar60[0];
                auVar60[0xb] = auVar60[0];
                auVar60[0xc] = auVar60[0];
                auVar60[0xd] = auVar60[0];
                auVar60[0xe] = auVar60[0];
                auVar60[0xf] = auVar60[0];
                auVar60[0x10] = auVar60[0];
                auVar60[0x11] = auVar60[0];
                auVar60[0x12] = auVar60[0];
                auVar60[0x13] = auVar60[0];
                auVar60[0x14] = auVar60[0];
                auVar60[0x15] = auVar60[0];
                auVar60[0x16] = auVar60[0];
                auVar60[0x17] = auVar60[0];
                auVar60[0x18] = auVar60[0];
                auVar60[0x19] = auVar60[0];
                auVar60[0x1a] = auVar60[0];
                auVar60[0x1b] = auVar60[0];
                auVar60[0x1c] = auVar60[0];
                auVar60[0x1d] = auVar60[0];
                auVar60[0x1e] = auVar60[0];
                auVar60[0x1f] = auVar60[0];
                auVar34 = vpalignr_avx2(auVar60,auVar62._0_32_,1);
                auVar47 = vpinsrb_avx(auVar34._16_16_,(uint)(byte)ptr_00[uVar18 + 0x1f],0xf);
                auVar49 = vpalignr_avx2(ZEXT1632(auVar49._16_16_),auVar49,1);
                auVar48 = vpinsrb_avx(auVar49._16_16_,(uint)(byte)ptr_01[uVar18 + 0x1f],0xf);
                auVar61._0_16_ = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar34._0_16_;
                auVar61._16_16_ = ZEXT116(0) * auVar34._16_16_ + ZEXT116(1) * auVar47;
                auVar56._0_16_ = ZEXT116(0) * auVar48 + ZEXT116(1) * auVar49._0_16_;
                auVar56._16_16_ = ZEXT116(0) * auVar49._16_16_ + ZEXT116(1) * auVar48;
                auVar49 = vpsubsb_avx2(auVar61,auVar54);
                auVar34 = vpsubsb_avx2(auVar56,auVar44);
                auVar40 = vpmaxsb_avx2(auVar49,auVar34);
                auVar49 = vpsubsb_avx2(auVar62._0_32_,auVar54);
                auVar55 = vpsubsb_avx2(auVar55,auVar44);
                auVar35 = vpmaxsb_avx2(auVar49,auVar55);
                auVar51._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar3;
                auVar51._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar31;
                auVar49 = vpaddsb_avx2(auVar37,auVar51);
                auVar55 = vpmaxsb_avx2(auVar35,auVar40);
                auVar49 = vpmaxsb_avx2(auVar49,auVar55);
                auVar55 = vpcmpeqb_avx2(auVar46,_DAT_008a5a80);
                auVar34 = vpblendvb_avx2(auVar49,local_1a8,auVar55);
                auVar62 = ZEXT3264(auVar34);
                if (0x1f < uVar18) {
                  auVar49 = vpminsb_avx2(auVar58._0_32_,auVar34);
                  auVar58 = ZEXT3264(auVar49);
                  local_158 = vpmaxsb_avx2(local_158,auVar34);
                }
                auVar49 = vpblendvb_avx2(auVar40,auVar43,auVar55);
                auVar55 = vpblendvb_avx2(auVar35,auVar43,auVar55);
                ptr_00[uVar18] = auVar34[0];
                ptr_01[uVar18] = auVar49[0];
                auVar37 = vpcmpeqb_avx2(auVar46,auVar42);
                auVar37 = vpand_avx2(auVar37,auVar5);
                auVar52[8] = 1;
                auVar52._0_8_ = 0x101010101010101;
                auVar52[9] = 1;
                auVar52[10] = 1;
                auVar52[0xb] = 1;
                auVar52[0xc] = 1;
                auVar52[0xd] = 1;
                auVar52[0xe] = 1;
                auVar52[0xf] = 1;
                auVar52[0x10] = 1;
                auVar52[0x11] = 1;
                auVar52[0x12] = 1;
                auVar52[0x13] = 1;
                auVar52[0x14] = 1;
                auVar52[0x15] = 1;
                auVar52[0x16] = 1;
                auVar52[0x17] = 1;
                auVar52[0x18] = 1;
                auVar52[0x19] = 1;
                auVar52[0x1a] = 1;
                auVar52[0x1b] = 1;
                auVar52[0x1c] = 1;
                auVar52[0x1d] = 1;
                auVar52[0x1e] = 1;
                auVar52[0x1f] = 1;
                auVar34 = vpblendvb_avx2(auVar57._0_32_,auVar34,auVar37);
                auVar57 = ZEXT3264(auVar34);
                auVar46 = vpaddsb_avx2(auVar46,auVar52);
                auVar37 = auVar61;
              }
              auVar38[8] = 0x20;
              auVar38._0_8_ = 0x2020202020202020;
              auVar38[9] = 0x20;
              auVar38[10] = 0x20;
              auVar38[0xb] = 0x20;
              auVar38[0xc] = 0x20;
              auVar38[0xd] = 0x20;
              auVar38[0xe] = 0x20;
              auVar38[0xf] = 0x20;
              auVar38[0x10] = 0x20;
              auVar38[0x11] = 0x20;
              auVar38[0x12] = 0x20;
              auVar38[0x13] = 0x20;
              auVar38[0x14] = 0x20;
              auVar38[0x15] = 0x20;
              auVar38[0x16] = 0x20;
              auVar38[0x17] = 0x20;
              auVar38[0x18] = 0x20;
              auVar38[0x19] = 0x20;
              auVar38[0x1a] = 0x20;
              auVar38[0x1b] = 0x20;
              auVar38[0x1c] = 0x20;
              auVar38[0x1d] = 0x20;
              auVar38[0x1e] = 0x20;
              auVar38[0x1f] = 0x20;
              local_178 = vpaddsb_avx2(local_178,auVar38);
              local_1a8 = vpsubsb_avx2(local_1a8,auVar50);
            }
            iVar10 = 0x20;
            while (bVar30 = iVar10 != 0, iVar10 = iVar10 + -1, bVar30) {
              if (cVar20 < auVar57[0x17]) {
                cVar20 = auVar57[0x17];
              }
              auVar53 = auVar57._0_32_;
              auVar33 = vperm2i128_avx2(auVar53,auVar53,0x28);
              auVar33 = vpalignr_avx2(auVar53,auVar33,0xf);
              auVar57 = ZEXT3264(auVar33);
            }
            auVar33 = vpcmpgtb_avx2(auVar43,auVar58._0_32_);
            auVar4[1] = cVar7;
            auVar4[0] = cVar7;
            auVar4[2] = cVar7;
            auVar4[3] = cVar7;
            auVar4[4] = cVar7;
            auVar4[5] = cVar7;
            auVar4[6] = cVar7;
            auVar4[7] = cVar7;
            auVar4[8] = cVar7;
            auVar4[9] = cVar7;
            auVar4[10] = cVar7;
            auVar4[0xb] = cVar7;
            auVar4[0xc] = cVar7;
            auVar4[0xd] = cVar7;
            auVar4[0xe] = cVar7;
            auVar4[0xf] = cVar7;
            auVar4[0x10] = cVar7;
            auVar4[0x11] = cVar7;
            auVar4[0x12] = cVar7;
            auVar4[0x13] = cVar7;
            auVar4[0x14] = cVar7;
            auVar4[0x15] = cVar7;
            auVar4[0x16] = cVar7;
            auVar4[0x17] = cVar7;
            auVar4[0x18] = cVar7;
            auVar4[0x19] = cVar7;
            auVar4[0x1a] = cVar7;
            auVar4[0x1b] = cVar7;
            auVar4[0x1c] = cVar7;
            auVar4[0x1d] = cVar7;
            auVar4[0x1e] = cVar7;
            auVar4[0x1f] = cVar7;
            auVar53 = vpcmpgtb_avx2(local_158,auVar4);
            auVar33 = vpor_avx2(auVar33,auVar53);
            if ((((((((((((((((((((((((((((((((auVar33 >> 7 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0 ||
                                             (auVar33 >> 0xf & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar33 >> 0x17 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar33 >> 0x1f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar33 >> 0x27 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar33 >> 0x2f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar33 >> 0x37 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar33 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar33 >> 0x47 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar33 >> 0x4f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar33 >> 0x57 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar33 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar33 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar33 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar33 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar33 >> 0x7f,0) != '\0') ||
                              (auVar33 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             (auVar33 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar33 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar33 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar33 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar33 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar33 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar33 >> 0xbf,0) != '\0') ||
                      (auVar33 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar33 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar33 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar33 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar33 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar33 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar33 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                auVar33[0x1f] < '\0') {
              *(byte *)&ppVar11->flag = (byte)ppVar11->flag | 0x40;
              auVar32 = ZEXT816(0) << 0x20;
              cVar20 = '\0';
            }
            ppVar11->score = (int)cVar20;
            uVar1 = vmovlps_avx(auVar32);
            ppVar11->end_query = (int)uVar1;
            ppVar11->end_ref = (int)((ulong)uVar1 >> 0x20);
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(local_290);
              return ppVar11;
            }
            return ppVar11;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar15 = "_s1";
      }
      else {
        if (0 < _s1Len) goto LAB_007145c1;
        __format = "%s: %s must be > 0\n";
        pcVar15 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_diag_avx2_256_8",pcVar15);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int8_t * restrict s1 = NULL;
    int8_t * restrict s2B = NULL;
    int8_t * restrict _H_pr = NULL;
    int8_t * restrict _F_pr = NULL;
    int8_t * restrict s2 = NULL;
    int8_t * restrict H_pr = NULL;
    int8_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMax;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 32; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi8(NEG_LIMIT);
    vOpen = _mm256_set1_epi8(open);
    vGap  = _mm256_set1_epi8(gap);
    vOne = _mm256_set1_epi8(1);
    vN = _mm256_set1_epi8(N);
    vGapN = _mm256_set1_epi8(gap*N);
    vNegOne = _mm256_set1_epi8(-1);
    vI = _mm256_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15,16,17,18,19,20,21,22,23,24,25,26,27,28,29,30,31);
    vJreset = _mm256_set_epi8(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15,-16,-17,-18,-19,-20,-21,-22,-23,-24,-25,-26,-27,-28,-29,-30,-31);
    vMax = vNegInf;
    vILimit = _mm256_set1_epi8(s1Len);
    vILimit1 = _mm256_subs_epi8(vILimit, vOne);
    vJLimit = _mm256_set1_epi8(s2Len);
    vJLimit1 = _mm256_subs_epi8(vJLimit, vOne);
    vIBoundary = _mm256_set_epi8(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap,
            -open-8*gap,
            -open-9*gap,
            -open-10*gap,
            -open-11*gap,
            -open-12*gap,
            -open-13*gap,
            -open-14*gap,
            -open-15*gap,
            -open-16*gap,
            -open-17*gap,
            -open-18*gap,
            -open-19*gap,
            -open-20*gap,
            -open-21*gap,
            -open-22*gap,
            -open-23*gap,
            -open-24*gap,
            -open-25*gap,
            -open-26*gap,
            -open-27*gap,
            -open-28*gap,
            -open-29*gap,
            -open-30*gap,
            -open-31*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int8_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int8_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int8_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int8_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf;
        __m256i vWH = vNegInf;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        const int * const restrict matrow16 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+16] : ((i+16 >= s1Len) ? s1Len-1 : i+16))];
        const int * const restrict matrow17 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+17] : ((i+17 >= s1Len) ? s1Len-1 : i+17))];
        const int * const restrict matrow18 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+18] : ((i+18 >= s1Len) ? s1Len-1 : i+18))];
        const int * const restrict matrow19 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+19] : ((i+19 >= s1Len) ? s1Len-1 : i+19))];
        const int * const restrict matrow20 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+20] : ((i+20 >= s1Len) ? s1Len-1 : i+20))];
        const int * const restrict matrow21 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+21] : ((i+21 >= s1Len) ? s1Len-1 : i+21))];
        const int * const restrict matrow22 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+22] : ((i+22 >= s1Len) ? s1Len-1 : i+22))];
        const int * const restrict matrow23 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+23] : ((i+23 >= s1Len) ? s1Len-1 : i+23))];
        const int * const restrict matrow24 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+24] : ((i+24 >= s1Len) ? s1Len-1 : i+24))];
        const int * const restrict matrow25 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+25] : ((i+25 >= s1Len) ? s1Len-1 : i+25))];
        const int * const restrict matrow26 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+26] : ((i+26 >= s1Len) ? s1Len-1 : i+26))];
        const int * const restrict matrow27 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+27] : ((i+27 >= s1Len) ? s1Len-1 : i+27))];
        const int * const restrict matrow28 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+28] : ((i+28 >= s1Len) ? s1Len-1 : i+28))];
        const int * const restrict matrow29 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+29] : ((i+29 >= s1Len) ? s1Len-1 : i+29))];
        const int * const restrict matrow30 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+30] : ((i+30 >= s1Len) ? s1Len-1 : i+30))];
        const int * const restrict matrow31 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+31] : ((i+31 >= s1Len) ? s1Len-1 : i+31))];
        vNH = _mm256_srli_si256_rpl(vNH, 1);
        vNH = _mm256_insert_epi8_rpl(vNH, H_pr[-1], 31);
        vWH = _mm256_srli_si256_rpl(vWH, 1);
        vWH = _mm256_insert_epi8_rpl(vWH, -open - i*gap, 31);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 1);
            vNH = _mm256_insert_epi8_rpl(vNH, H_pr[j], 31);
            vF = _mm256_srli_si256_rpl(vF, 1);
            vF = _mm256_insert_epi8_rpl(vF, F_pr[j], 31);
            vF = _mm256_max_epi8(
                    _mm256_subs_epi8(vNH, vOpen),
                    _mm256_subs_epi8(vF, vGap));
            vE = _mm256_max_epi8(
                    _mm256_subs_epi8(vWH, vOpen),
                    _mm256_subs_epi8(vE, vGap));
            vMat = _mm256_set_epi8(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]],
                    matrow16[s2[j-16]],
                    matrow17[s2[j-17]],
                    matrow18[s2[j-18]],
                    matrow19[s2[j-19]],
                    matrow20[s2[j-20]],
                    matrow21[s2[j-21]],
                    matrow22[s2[j-22]],
                    matrow23[s2[j-23]],
                    matrow24[s2[j-24]],
                    matrow25[s2[j-25]],
                    matrow26[s2[j-26]],
                    matrow27[s2[j-27]],
                    matrow28[s2[j-28]],
                    matrow29[s2[j-29]],
                    matrow30[s2[j-30]],
                    matrow31[s2[j-31]]
                    );
            vNWH = _mm256_adds_epi8(vNWH, vMat);
            vWH = _mm256_max_epi8(vNWH, vE);
            vWH = _mm256_max_epi8(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi8(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-31] = (int8_t)_mm256_extract_epi8_rpl(vWH,0);
            F_pr[j-31] = (int8_t)_mm256_extract_epi8_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m256i cond_valid_I = _mm256_cmpeq_epi8(vI, vILimit1);
                __m256i cond_valid_J = _mm256_cmpeq_epi8(vJ, vJLimit1);
                __m256i cond_all = _mm256_and_si256(cond_valid_I, cond_valid_J);
                vMax = _mm256_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm256_adds_epi8(vJ, vOne);
        }
        vI = _mm256_adds_epi8(vI, vN);
        vIBoundary = _mm256_subs_epi8(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int8_t value;
        value = (int8_t) _mm256_extract_epi8_rpl(vMax, 31);
        if (value > score) {
            score = value;
        }
        vMax = _mm256_slli_si256_rpl(vMax, 1);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}